

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::precisionReached(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *newpricertol)

{
  type_conflict5 tVar1;
  Verbosity VVar2;
  element_type *peVar3;
  cpp_dec_float<100U,_int,_void> *this_00;
  undefined8 in_RSI;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity;
  bool reached;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumViolConst;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxViolConst;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumViolBounds;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxViolBounds;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumViolRedCost;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxViolRedCost;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff978;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff980;
  type_conflict5 local_631;
  undefined1 local_630 [80];
  undefined1 local_5e0 [80];
  undefined1 local_590 [80];
  undefined1 local_540 [80];
  undefined1 local_4f0 [80];
  undefined1 local_4a0 [80];
  undefined1 local_450 [80];
  undefined1 local_400 [80];
  undefined4 local_3b0;
  Verbosity local_3ac;
  undefined8 local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a0;
  undefined1 local_350 [80];
  Real local_300;
  Real local_2f8;
  Real local_2f0;
  type_conflict5 local_2e1;
  undefined1 local_2e0 [80];
  undefined1 local_290 [80];
  undefined1 local_240 [80];
  undefined1 local_1f0 [80];
  undefined1 local_1a0 [80];
  undefined1 local_150 [80];
  undefined8 local_100;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  undefined8 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_f0 = local_150;
  local_100 = in_RSI;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff980);
  local_e8 = local_1a0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff980);
  local_e0 = local_1f0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff980);
  local_d8 = local_240;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff980);
  local_d0 = local_290;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff980);
  local_c8 = local_2e0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff980);
  (*(in_RDI->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x72])(in_RDI,local_150,local_1a0);
  (*(in_RDI->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x70])(in_RDI,local_1f0,local_240);
  (*(in_RDI->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x6f])(in_RDI,local_290,local_2e0);
  tolerances(in_RDI);
  peVar3 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4bdd4e);
  local_2f0 = Tolerances::floatingPointOpttol(peVar3);
  tVar1 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff978,(double *)0x4bdd74);
  local_631 = false;
  if (tVar1) {
    tolerances(in_RDI);
    peVar3 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4bdd98);
    local_2f8 = Tolerances::floatingPointFeastol(peVar3);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff978,(double *)0x4bddbe);
    local_631 = false;
    if (tVar1) {
      tolerances(in_RDI);
      peVar3 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4bdddf);
      local_300 = Tolerances::floatingPointFeastol(peVar3);
      local_631 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffff978,(double *)0x4bde05);
    }
  }
  local_2e1 = local_631;
  if (local_631 == false) {
    (*in_RDI->thepricer->_vptr_SPxPricer[5])(&local_3a0);
    local_3a8 = 0x4024000000000000;
    local_28 = local_350;
    local_30 = &local_3a0;
    local_38 = &local_3a8;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_30);
    local_20 = local_350;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff980);
    local_10 = local_350;
    local_18 = local_30;
    local_8 = local_38;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
              (in_stack_fffffffffffff980,in_stack_fffffffffffff978,(double *)0x4bdefe);
    local_48 = local_100;
    local_50 = local_350;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    if ((in_RDI->spxout != (SPxOut *)0x0) &&
       (VVar2 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar2)) {
      local_3ac = SPxOut::getVerbosity(in_RDI->spxout);
      local_3b0 = 5;
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_3b0);
      this_00 = (cpp_dec_float<100U,_int,_void> *)
                soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                                   (char *)in_stack_fffffffffffff978);
      (*in_RDI->thepricer->_vptr_SPxPricer[5])(local_400);
      soplex::operator<<((SPxOut *)this_00,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,(char *)in_stack_fffffffffffff978);
      local_b8 = local_450;
      local_c0 = local_100;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (this_00,in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,(char *)in_stack_fffffffffffff978);
      local_a8 = local_4a0;
      local_b0 = local_150;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (this_00,in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,(char *)in_stack_fffffffffffff978);
      local_98 = local_4f0;
      local_a0 = local_1f0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (this_00,in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,(char *)in_stack_fffffffffffff978);
      local_88 = local_540;
      local_90 = local_290;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (this_00,in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,(char *)in_stack_fffffffffffff978);
      local_78 = local_590;
      local_80 = local_1a0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (this_00,in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,(char *)in_stack_fffffffffffff978);
      local_68 = local_5e0;
      local_70 = local_240;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (this_00,in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,(char *)in_stack_fffffffffffff978);
      local_58 = local_630;
      local_60 = local_2e0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (this_00,in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)this_00,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_3ac);
    }
  }
  return (bool)(local_2e1 & 1);
}

Assistant:

bool SPxSolverBase<R>::precisionReached(R& newpricertol) const
{
   R maxViolRedCost;
   R sumViolRedCost;
   R maxViolBounds;
   R sumViolBounds;
   R maxViolConst;
   R sumViolConst;

   qualRedCostViolation(maxViolRedCost, sumViolRedCost);
   qualBoundViolation(maxViolBounds, sumViolBounds);
   qualConstraintViolation(maxViolConst, sumViolConst);

   // is the solution good enough ?
   bool reached = maxViolRedCost < tolerances()->floatingPointOpttol()
                  && maxViolBounds < tolerances()->floatingPointFeastol()
                  && maxViolConst < tolerances()->floatingPointFeastol();

   if(!reached)
   {
      newpricertol = thepricer->pricingTolerance() / 10.0;

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Precision not reached: Pricer tolerance = "
                    << thepricer->pricingTolerance()
                    << " new tolerance = " << newpricertol
                    << std::endl
                    << " maxViolRedCost= " << maxViolRedCost
                    << " maxViolBounds= " << maxViolBounds
                    << " maxViolConst= " << maxViolConst
                    << std::endl
                    << " sumViolRedCost= " << sumViolRedCost
                    << " sumViolBounds= " << sumViolBounds
                    << " sumViolConst= " << sumViolConst
                    << std::endl;);
   }

   return reached;
}